

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reoUnits.c
# Opt level: O0

void reoUnitsAddUnitToPlane(reo_plane *pPlane,reo_unit *pUnit)

{
  reo_unit *pUnit_local;
  reo_plane *pPlane_local;
  
  if (pPlane->pHead == (reo_unit *)0x0) {
    pPlane->pHead = pUnit;
    pUnit->Next = (reo_unit *)0x0;
  }
  else {
    pUnit->Next = pPlane->pHead;
    pPlane->pHead = pUnit;
  }
  pPlane->statsNodes = pPlane->statsNodes + 1;
  return;
}

Assistant:

void reoUnitsAddUnitToPlane( reo_plane * pPlane, reo_unit * pUnit )
{
    if ( pPlane->pHead == NULL )
    {
        pPlane->pHead = pUnit;
        pUnit->Next   = NULL;
    }
    else
    {
        pUnit->Next   = pPlane->pHead;
        pPlane->pHead = pUnit;
    }
    pPlane->statsNodes++;
}